

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__de_iphone(stbi__png *z)

{
  byte bVar1;
  byte bVar2;
  stbi__context *psVar3;
  uint uVar4;
  stbi_uc t_2;
  stbi_uc t_1;
  stbi_uc a;
  byte *pbStack_28;
  stbi_uc t;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  stbi__context *s;
  stbi__png *z_local;
  
  psVar3 = z->s;
  uVar4 = psVar3->img_x * psVar3->img_y;
  pbStack_28 = z->out;
  if (psVar3->img_out_n == 3) {
    for (p._4_4_ = 0; p._4_4_ < uVar4; p._4_4_ = p._4_4_ + 1) {
      bVar1 = *pbStack_28;
      *pbStack_28 = pbStack_28[2];
      pbStack_28[2] = bVar1;
      pbStack_28 = pbStack_28 + 3;
    }
  }
  else {
    if (psVar3->img_out_n != 4) {
      __assert_fail("s->img_out_n == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                    ,0x1127,"void stbi__de_iphone(stbi__png *)");
    }
    if (stbi__unpremultiply_on_load == 0) {
      for (p._4_4_ = 0; p._4_4_ < uVar4; p._4_4_ = p._4_4_ + 1) {
        bVar1 = *pbStack_28;
        *pbStack_28 = pbStack_28[2];
        pbStack_28[2] = bVar1;
        pbStack_28 = pbStack_28 + 4;
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < uVar4; p._4_4_ = p._4_4_ + 1) {
        bVar1 = pbStack_28[3];
        bVar2 = *pbStack_28;
        if (bVar1 == 0) {
          *pbStack_28 = pbStack_28[2];
          pbStack_28[2] = bVar2;
        }
        else {
          *pbStack_28 = (byte)((ulong)((uint)pbStack_28[2] * 0xff) / (ulong)(long)(int)(uint)bVar1);
          pbStack_28[1] =
               (byte)((ulong)((uint)pbStack_28[1] * 0xff) / (ulong)(long)(int)(uint)bVar1);
          pbStack_28[2] = (byte)((ulong)((uint)bVar2 * 0xff) / (ulong)(long)(int)(uint)bVar1);
        }
        pbStack_28 = pbStack_28 + 4;
      }
    }
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               p[0] = p[2] * 255 / a;
               p[1] = p[1] * 255 / a;
               p[2] =  t   * 255 / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}